

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

int string_get(void *data)

{
  byte bVar1;
  
  bVar1 = *(byte *)(*data + *(long *)((long)data + 8));
  if (bVar1 != 0) {
    *(long *)((long)data + 8) = *(long *)((long)data + 8) + 1;
    return (int)bVar1;
  }
  return -1;
}

Assistant:

static int string_get(void *data)
{
	char c;
	string_data_t *stream = (string_data_t *)data;
	c = stream->data[stream->pos];
	if (c == '\0')
		return EOF;
	else
	{
		stream->pos++;
		return (unsigned char)c;
	}
}